

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrFoveationEyeTrackedStateMETA *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string *prefix_00;
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  long lVar4;
  invalid_argument *piVar5;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  XrVector2f *local_2b8;
  string flags_prefix;
  string local_288;
  string foveationcenter_prefix;
  string type_prefix;
  string next_prefix;
  string local_208;
  undefined1 local_1e8 [64];
  ostringstream oss_foveationCenter_array;
  uint auStack_190 [2];
  PFN_xrCreateSession local_188;
  PFN_xrDestroySession p_Stack_180;
  PFN_xrEnumerateReferenceSpaces local_178;
  PFN_xrCreateReferenceSpace p_Stack_170;
  
  PointerToHexString<XrFoveationEyeTrackedStateMETA>(value);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_foveationCenter_array);
  std::__cxx11::string::~string((string *)&oss_foveationCenter_array);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_foveationCenter_array,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_foveationCenter_array);
    std::__cxx11::string::~string((string *)&oss_foveationCenter_array);
  }
  else {
    local_178 = (PFN_xrEnumerateReferenceSpaces)0x0;
    p_Stack_170 = (PFN_xrCreateReferenceSpace)0x0;
    local_188 = (PFN_xrCreateSession)0x0;
    p_Stack_180 = (PFN_xrDestroySession)0x0;
    auStack_190[0] = 0;
    auStack_190[1] = 0;
    _oss_foveationCenter_array = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_foveationCenter_array);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_foveationCenter_array);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_208,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_208,contents);
  std::__cxx11::string::~string((string *)&local_208);
  if (bVar2) {
    std::__cxx11::string::string((string *)&foveationcenter_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&foveationcenter_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_foveationCenter_array);
    *(uint *)((long)auStack_190 + *(long *)(_oss_foveationCenter_array + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_oss_foveationCenter_array + -0x18)) & 0xffffffb5 |
         8;
    local_2b8 = value->foveationCenter;
    std::ostream::_M_insert<void_const*>(&oss_foveationCenter_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector2f*",&foveationcenter_prefix,&flags_prefix);
    std::__cxx11::string::~string((string *)&flags_prefix);
    lVar4 = 0;
    prefix_00 = (string *)(local_1e8 + 0x20);
    while( true ) {
      if (lVar4 == 2) {
        std::__cxx11::string::string((string *)&flags_prefix,(string *)prefix);
        std::__cxx11::string::append((char *)&flags_prefix);
        std::__cxx11::to_string(&local_288,value->flags);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[36],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [36])"XrFoveationEyeTrackedStateFlagsMETA",&flags_prefix,
                   &local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&flags_prefix);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_foveationCenter_array);
        std::__cxx11::string::~string((string *)&foveationcenter_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      std::__cxx11::string::string((string *)&flags_prefix,(string *)&foveationcenter_prefix);
      std::__cxx11::string::append((char *)&flags_prefix);
      std::__cxx11::to_string(&local_288,(uint)lVar4);
      std::__cxx11::string::append((string *)&flags_prefix);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::append((char *)&flags_prefix);
      std::__cxx11::string::string((string *)prefix_00,(string *)&flags_prefix);
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_1e8;
      std::__cxx11::string::string((string *)local_1e8,"XrVector2f",(allocator *)&local_288);
      bVar2 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,local_2b8,prefix_00,(string *)local_1e8,false,
                         contents);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)prefix_00);
      if (!bVar2) break;
      std::__cxx11::string::~string((string *)&flags_prefix);
      lVar4 = lVar4 + 1;
      local_2b8 = local_2b8 + 1;
    }
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrFoveationEyeTrackedStateMETA* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string foveationcenter_prefix = prefix;
        foveationcenter_prefix += "foveationCenter";
        std::ostringstream oss_foveationCenter_array;
        oss_foveationCenter_array << std::hex << reinterpret_cast<const void*>(value->foveationCenter);
        contents.emplace_back("XrVector2f*", foveationcenter_prefix, oss_foveationCenter_array.str());
        for (uint32_t value_foveationcenter_inc = 0; value_foveationcenter_inc < XR_FOVEATION_CENTER_SIZE_META; ++value_foveationcenter_inc) {
            std::string foveationcenter_array_prefix = foveationcenter_prefix;
            foveationcenter_array_prefix += "[";
            foveationcenter_array_prefix += std::to_string(value_foveationcenter_inc);
            foveationcenter_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->foveationCenter[value_foveationcenter_inc], foveationcenter_array_prefix, "XrVector2f", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        std::string flags_prefix = prefix;
        flags_prefix += "flags";
        contents.emplace_back("XrFoveationEyeTrackedStateFlagsMETA", flags_prefix, std::to_string(value->flags));
        return true;
    } catch(...) {
    }
    return false;
}